

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::Snapshot::ComputeRelativePathTopBinary(Snapshot *this)

{
  bool bVar1;
  char *pcVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  Snapshot *this_00;
  allocator local_a9;
  string result;
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> snapshots;
  Snapshot snapshot;
  string currentBinary;
  
  snapshot.Position.Position = (this->Position).Position;
  snapshot.State = this->State;
  snapshot.Position.Tree = (this->Position).Tree;
  snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
            (&snapshots,&snapshot);
  while( true ) {
    GetBuildsystemDirectoryParent((Snapshot *)&result,&snapshot);
    snapshot.Position.Position = result.field_2._M_allocated_capacity;
    snapshot.State = (cmState *)result._M_dataplus._M_p;
    snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)result._M_string_length;
    bVar1 = IsValid(&snapshot);
    if (!bVar1) break;
    std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
              (&snapshots,&snapshot);
  }
  pcVar2 = GetCurrentBinaryDirectory
                     (snapshots.
                      super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&result,pcVar2,(allocator *)&currentBinary);
  this_00 = snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while (this_00 = this_00 + 1,
        this_00 !=
        snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
        super__Vector_impl_data._M_finish) {
    pcVar2 = GetCurrentBinaryDirectory(this_00);
    std::__cxx11::string::string((string *)&currentBinary,pcVar2,&local_a9);
    bVar1 = cmsys::SystemTools::IsSubDirectory(&result,&currentBinary);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&result);
    }
    std::__cxx11::string::~string((string *)&currentBinary);
  }
  if (1 < result._M_string_length) {
    std::__cxx11::string::substr((ulong)&currentBinary,(ulong)&result);
    bVar1 = std::operator!=(&currentBinary,"//");
    std::__cxx11::string::~string((string *)&currentBinary);
    if (!bVar1) {
      pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
      pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                         (&pSVar3->BuildSystemDirectory);
      std::__cxx11::string::assign((char *)&pBVar4->RelativePathTopBinary);
      goto LAB_0026d0db;
    }
  }
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  std::__cxx11::string::_M_assign((string *)&pBVar4->RelativePathTopBinary);
LAB_0026d0db:
  std::__cxx11::string::~string((string *)&result);
  std::_Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::~_Vector_base
            (&snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>);
  return;
}

Assistant:

void cmState::Snapshot::ComputeRelativePathTopBinary()
{
  cmState::Snapshot snapshot = *this;
  std::vector<cmState::Snapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true)
    {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid())
      {
      snapshots.push_back(snapshot);
      }
    else
      {
      break;
      }
    }

  std::string result =
      snapshots.front().GetCurrentBinaryDirectory();

  for (std::vector<cmState::Snapshot>::const_iterator it =
       snapshots.begin() + 1; it != snapshots.end(); ++it)
    {
    std::string currentBinary = it->GetCurrentBinaryDirectory();
    if(cmSystemTools::IsSubDirectory(result, currentBinary))
      {
      result = currentBinary;
      }
    }

  // The current working directory on Windows cannot be a network
  // path.  Therefore relative paths cannot work when the binary tree
  // is a network path.
  if(result.size() < 2 || result.substr(0, 2) != "//")
    {
    this->Position->BuildSystemDirectory->RelativePathTopBinary = result;
    }
  else
    {
    this->Position->BuildSystemDirectory->RelativePathTopBinary = "";
    }
}